

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepperHHT.cpp
# Opt level: O2

ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode> * __thiscall
chrono::my_enum_mappers::HHT_Mode_mapper::operator()
          (ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode> *__return_storage_ptr__,
          HHT_Mode_mapper *this,HHT_Mode *mval)

{
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_28;
  
  std::
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_28,
                 &(this->super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>).enummap.
                  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>::ChEnumMapper
            (__return_storage_ptr__,
             (shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>_>
              *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  __return_storage_ptr__->value_ptr = mval;
  return __return_storage_ptr__;
}

Assistant:

void ChTimestepperHHT::ArchiveOUT(ChArchiveOut& archive) {
    // version number
    archive.VersionWrite<ChTimestepperHHT>();
    // serialize parent class:
    ChTimestepperIIorder::ArchiveOUT(archive);
    ChImplicitIterativeTimestepper::ArchiveOUT(archive);
    // serialize all member data:
    archive << CHNVP(alpha);
    archive << CHNVP(beta);
    archive << CHNVP(gamma);
    archive << CHNVP(scaling);
    my_enum_mappers::HHT_Mode_mapper modemapper;
    archive << CHNVP(modemapper(mode), "mode");
}